

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValue * QCborContainerPrivate::findCborMapKey<QStringView>(QCborValue *self,QStringView key)

{
  long lVar1;
  QStringView key_00;
  bool bVar2;
  qsizetype qVar3;
  qsizetype in_RCX;
  storage_type_conflict *in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborValueConstRef QVar4;
  qsizetype idx;
  long lVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QCborValue::isMap((QCborValue *)0x47add1);
  if ((bVar2) && (in_RSI->usedData != 0)) {
    key_00.m_data = in_RDX;
    key_00.m_size = in_RCX;
    QVar4 = findCborMapKey<QStringView>(in_RSI,key_00);
    lVar5 = QVar4.i;
    qVar3 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RSI->usedData + 0x28));
    if (lVar5 < qVar3) {
      valueAt((QCborContainerPrivate *)QVar4.i,(qsizetype)QVar4.d);
      goto LAB_0047ae77;
    }
  }
  ::QCborValue::QCborValue((QCborValue *)in_RDI);
LAB_0047ae77:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QCborValue findCborMapKey(const QCborValue &self, KeyType key)
    {
        if (self.isMap() && self.container) {
            qsizetype idx = self.container->findCborMapKey(key).i;
            if (idx < self.container->elements.size())
                return self.container->valueAt(idx);
        }
        return QCborValue();
    }